

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpDisassemble::OnLocalDecl
          (BinaryReaderObjdumpDisassemble *this,Index decl_index,Index count,Type type)

{
  ulong uVar1;
  ulong local_40;
  size_t i_1;
  size_t i;
  size_t data_size;
  Offset offset;
  Index count_local;
  Index decl_index_local;
  BinaryReaderObjdumpDisassemble *this_local;
  Type type_local;
  
  data_size = this->current_opcode_offset;
  uVar1 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
          state)->offset - data_size;
  this_local._0_4_ = type.enum_;
  printf(" %06zx:",data_size);
  for (i_1 = 0; local_40 = uVar1, i_1 < uVar1 && i_1 < 9; i_1 = i_1 + 1) {
    printf(" %02x",(ulong)(this->super_BinaryReaderObjdumpBase).data_[data_size]);
    data_size = data_size + 1;
  }
  for (; local_40 < 9; local_40 = local_40 + 1) {
    printf("   ");
  }
  printf(" | local[%u",(ulong)this->local_index_);
  if (count != 1) {
    printf("..%u",(ulong)((this->local_index_ + count) - 1));
  }
  this->local_index_ = count + this->local_index_;
  Type::GetName((Type *)&this_local);
  printf("] type=%s\n");
  this->last_opcode_end = this->current_opcode_offset + uVar1;
  this->current_opcode_offset = this->last_opcode_end;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnLocalDecl(Index decl_index,
                                                   Index count,
                                                   Type type) {
  Offset offset = current_opcode_offset;
  size_t data_size = state->offset - offset;

  printf(" %06" PRIzx ":", offset);
  for (size_t i = 0; i < data_size && i < IMMEDIATE_OCTET_COUNT;
       i++, offset++) {
    printf(" %02x", data_[offset]);
  }
  for (size_t i = data_size; i < IMMEDIATE_OCTET_COUNT; i++) {
    printf("   ");
  }
  printf(" | local[%" PRIindex, local_index_);

  if (count != 1) {
    printf("..%" PRIindex "", local_index_ + count - 1);
  }
  local_index_ += count;

  printf("] type=%s\n", type.GetName());

  last_opcode_end = current_opcode_offset + data_size;
  current_opcode_offset = last_opcode_end;

  return Result::Ok;
}